

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_4UL>::reserve
          (ArrayWithPreallocation<soul::Value,_4UL> *this,size_t minSize)

{
  Value *pVVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if (this->numAllocated < minSize) {
    uVar2 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar2 != 0) {
      pVVar1 = (Value *)operator_new__(uVar2 << 6);
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < this->numActive; uVar4 = uVar4 + 1) {
        soul::Value::Value((Value *)((long)(&(pVVar1->allocatedData).allocatedData + -1) + lVar3),
                           (Value *)((long)(&(this->items->allocatedData).allocatedData + -1) +
                                    lVar3));
        soul::Value::~Value((Value *)((long)(&(this->items->allocatedData).allocatedData + -1) +
                                     lVar3));
        lVar3 = lVar3 + 0x40;
      }
      freeIfHeapAllocated(this);
      this->items = pVVar1;
    }
    this->numAllocated = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }